

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O3

void Net_ClearBuffers(void)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  FDynamicBuffer (*paFVar4) [36];
  
  lVar3 = 0;
  memset(localcmds,0,0xe10);
  memset(netcmds,0,0x1680);
  nettics[0] = 0;
  nettics[1] = 0;
  nettics[2] = 0;
  nettics[3] = 0;
  nettics[4] = 0;
  nettics[5] = 0;
  nettics[6] = 0;
  nettics[7] = 0;
  nodeingame[0] = true;
  nodeingame[1] = false;
  nodeingame[2] = false;
  nodeingame[3] = false;
  nodeingame[4] = false;
  nodeingame[5] = false;
  nodeingame[6] = false;
  nodeingame[7] = false;
  nodeforplayer[0] = 0;
  nodeforplayer[1] = 0;
  nodeforplayer[2] = 0;
  nodeforplayer[3] = 0;
  nodeforplayer[4] = 0;
  nodeforplayer[5] = 0;
  nodeforplayer[6] = 0;
  nodeforplayer[7] = 0;
  playerfornode[0] = 0;
  playerfornode[1] = 0;
  playerfornode[2] = 0;
  playerfornode[3] = 0;
  playerfornode[4] = 0;
  playerfornode[5] = 0;
  playerfornode[6] = 0;
  playerfornode[7] = 0;
  remoteresend[0] = false;
  remoteresend[1] = false;
  remoteresend[2] = false;
  remoteresend[3] = false;
  remoteresend[4] = false;
  remoteresend[5] = false;
  remoteresend[6] = false;
  remoteresend[7] = false;
  resendto[0] = 0;
  resendto[1] = 0;
  resendto[2] = 0;
  resendto[3] = 0;
  resendto[4] = 0;
  resendto[5] = 0;
  resendto[6] = 0;
  resendto[7] = 0;
  resendcount[0] = 0;
  resendcount[1] = 0;
  resendcount[2] = 0;
  resendcount[3] = 0;
  resendcount[4] = 0;
  resendcount[5] = 0;
  resendcount[6] = 0;
  resendcount[7] = 0;
  lastrecvtime[0] = 0;
  lastrecvtime[1] = 0;
  lastrecvtime[2] = 0;
  lastrecvtime[3] = 0;
  lastrecvtime[4] = 0;
  lastrecvtime[5] = 0;
  lastrecvtime[6] = 0;
  lastrecvtime[7] = 0;
  currrecvtime[4] = 0;
  currrecvtime[5] = 0;
  currrecvtime[6] = 0;
  currrecvtime[7] = 0;
  currrecvtime[0] = 0;
  currrecvtime[1] = 0;
  currrecvtime[2] = 0;
  currrecvtime[3] = 0;
  memset(consistancy,0,0x240);
  paFVar4 = NetSpecs;
  do {
    lVar2 = 0xc;
    do {
      if (*(int *)((long)&(*paFVar4)[0].m_Data + lVar2) < 0) {
        *(undefined4 *)((long)&(*paFVar4)[0].m_Data + lVar2) = 0;
        pvVar1 = M_Realloc_Dbg(*(void **)((long)&paFVar4[-1][0x23].m_Data + lVar2 + 4),0,
                               "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/d_net.cpp"
                               ,0x808);
        *(void **)((long)&paFVar4[-1][0x23].m_Data + lVar2 + 4) = pvVar1;
      }
      *(undefined4 *)((long)&paFVar4[-1][0x23].m_BufferLen + lVar2) = 0;
      lVar2 = lVar2 + 0x10;
    } while (lVar2 != 0x24c);
    lVar3 = lVar3 + 1;
    paFVar4 = paFVar4 + 1;
  } while (lVar3 != 8);
  oldentertics = entertic;
  gametic = 0;
  maketic = 0;
  lastglobalrecvtime = 0;
  return;
}

Assistant:

void Net_ClearBuffers ()
{
	int i, j;

	memset (localcmds, 0, sizeof(localcmds));
	memset (netcmds, 0, sizeof(netcmds));
	memset (nettics, 0, sizeof(nettics));
	memset (nodeingame, 0, sizeof(nodeingame));
	memset (nodeforplayer, 0, sizeof(nodeforplayer));
	memset (playerfornode, 0, sizeof(playerfornode));
	memset (remoteresend, 0, sizeof(remoteresend));
	memset (resendto, 0, sizeof(resendto));
	memset (resendcount, 0, sizeof(resendcount));
	memset (lastrecvtime, 0, sizeof(lastrecvtime));
	memset (currrecvtime, 0, sizeof(currrecvtime));
	memset (consistancy, 0, sizeof(consistancy));
	nodeingame[0] = true;

	for (i = 0; i < MAXPLAYERS; i++)
	{
		for (j = 0; j < BACKUPTICS; j++)
		{
			NetSpecs[i][j].SetData (NULL, 0);
		}
	}

	oldentertics = entertic;
	gametic = 0;
	maketic = 0;

	lastglobalrecvtime = 0;
}